

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O1

void __thiscall
ON_SubDFaceIterator::Internal_Init
          (ON_SubDFaceIterator *this,ON_SubDRef *subd_ref,uint face_count,ON_SubDFace *first,
          ON_SubDFace *last,ON_SubDComponentPtr component_ptr)

{
  Type TVar1;
  ON_SubDComponentPtr *pOVar2;
  ON_SubDComponentPtr local_28;
  
  pOVar2 = &local_28;
  local_28.m_ptr = component_ptr.m_ptr;
  ON_SubDRef::operator=(&this->m_subd_ref,subd_ref);
  if (((face_count != 0) && (first != (ON_SubDFace *)0x0)) && (last != (ON_SubDFace *)0x0)) {
    this->m_face_first = first;
    this->m_face_last = last;
    this->m_face_current = first;
    this->m_face_count = face_count;
    TVar1 = ON_SubDComponentPtr::ComponentType(&local_28);
    if (TVar1 == Unset) {
      pOVar2 = &ON_SubDComponentPtr::Null;
    }
    (this->m_component_ptr).m_ptr = pOVar2->m_ptr;
  }
  return;
}

Assistant:

void ON_SubDFaceIterator::Internal_Init(
  const ON_SubDRef& subd_ref,
  unsigned int face_count,
  const ON_SubDFace* first,
  const ON_SubDFace* last,
  ON_SubDComponentPtr component_ptr
)
{
  m_subd_ref = subd_ref;
  if (nullptr != first && nullptr != last && face_count > 0)
  {
    m_face_first = first;
    m_face_last = last;
    m_face_current = m_face_first;
    m_face_count = face_count;
    m_component_ptr
      = (ON_SubDComponentPtr::Type::Unset == component_ptr.ComponentType())
      ? ON_SubDComponentPtr::Null
      : component_ptr;
  }
}